

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cc
# Opt level: O3

CoordTopocentric * __thiscall
libsgp4::Observer::GetLookAngle(CoordTopocentric *__return_storage_ptr__,Observer *this,Eci *eci)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  TimeSpan ts;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  DateTime local_20;
  
  lVar7 = (eci->m_dt).m_encoded;
  local_20.m_encoded = lVar7;
  if (*(long *)(this + 0x18) != lVar7) {
    Eci::ToEci((Eci *)(this + 0x18),&local_20,(CoordGeodetic *)this);
    lVar7 = (eci->m_dt).m_encoded;
  }
  dVar1 = (eci->m_velocity).x;
  dVar2 = (eci->m_velocity).y;
  dVar3 = (eci->m_velocity).z;
  dVar4 = *(double *)(this + 0x40);
  dVar5 = *(double *)(this + 0x48);
  dVar6 = *(double *)(this + 0x50);
  dVar14 = (eci->m_position).x - *(double *)(this + 0x20);
  dVar9 = (eci->m_position).y - *(double *)(this + 0x28);
  dVar17 = (eci->m_position).z - *(double *)(this + 0x30);
  dVar10 = SQRT(dVar17 * dVar17 + dVar14 * dVar14 + dVar9 * dVar9);
  dVar15 = (double)lVar7 / 86400000000.0 + 1721425.5;
  dVar11 = floor(dVar15 + 0.5);
  dVar16 = (dVar11 + -0.5 + -2451545.0) / 36525.0;
  dVar15 = ((((dVar15 - (dVar11 + -0.5)) * 1.00273790935 * 86400.0 +
             ((dVar16 * -6.2e-06 + 0.093104) * dVar16 + 8640184.812866) * dVar16 + 24110.54841) /
            240.0) * 3.141592653589793) / 180.0;
  dVar11 = floor(dVar15 / 6.283185307179586);
  dVar15 = dVar11 * -6.283185307179586 + dVar15 + *(double *)(this + 8);
  dVar11 = floor(dVar15 / 6.283185307179586);
  dVar15 = dVar11 * -6.283185307179586 + dVar15;
  dVar11 = sin(*(double *)this);
  dVar16 = cos(*(double *)this);
  dVar12 = sin(dVar15);
  dVar15 = cos(dVar15);
  dVar18 = (dVar11 * dVar15 * dVar14 + dVar11 * dVar12 * dVar9) - dVar16 * dVar17;
  dVar13 = atan(-(dVar9 * dVar15 - dVar12 * dVar14) / dVar18);
  uVar8 = -(ulong)(0.0 < dVar18);
  dVar13 = (double)(uVar8 & (ulong)(dVar13 + 3.141592653589793) | ~uVar8 & (ulong)dVar13);
  dVar11 = asin((dVar11 * dVar17 + dVar15 * dVar16 * dVar14 + dVar16 * dVar12 * dVar9) / dVar10);
  __return_storage_ptr__->azimuth =
       (double)(~-(ulong)(dVar13 < 0.0) & (ulong)dVar13 |
               (ulong)(dVar13 + 6.283185307179586) & -(ulong)(dVar13 < 0.0));
  __return_storage_ptr__->elevation = dVar11;
  __return_storage_ptr__->range = dVar10;
  __return_storage_ptr__->range_rate =
       (dVar17 * (dVar3 - dVar6) + dVar14 * (dVar1 - dVar4) + dVar9 * (dVar2 - dVar5)) / dVar10;
  return __return_storage_ptr__;
}

Assistant:

CoordTopocentric Observer::GetLookAngle(const Eci &eci)
{
    /*
     * update the observers Eci to match the time of the Eci passed in
     * if necessary
     */
    Update(eci.GetDateTime());

    /*
     * calculate differences
     */
    Vector range_rate = eci.Velocity() - m_eci.Velocity();
    Vector range = eci.Position() - m_eci.Position();

    range.w = range.Magnitude();

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    double theta = eci.GetDateTime().ToLocalMeanSiderealTime(m_geo.longitude);

    double sin_lat = sin(m_geo.latitude);
    double cos_lat = cos(m_geo.latitude);
    double sin_theta = sin(theta);
    double cos_theta = cos(theta);

    double top_s = sin_lat * cos_theta * range.x
        + sin_lat * sin_theta * range.y - cos_lat * range.z;
    double top_e = -sin_theta * range.x
        + cos_theta * range.y;
    double top_z = cos_lat * cos_theta * range.x 
        + cos_lat * sin_theta * range.y + sin_lat * range.z;
    double az = atan(-top_e / top_s);

    if (top_s > 0.0)
    {
        az += kPI;
    }

    if (az < 0.0)
    {
        az += 2.0 * kPI;
    }

    double el = asin(top_z / range.w);
    double rate = range.Dot(range_rate) / range.w;

    /*
     * azimuth in radians
     * elevation in radians
     * range in km
     * range rate in km/s
     */
    return CoordTopocentric(az,
            el,
            range.w,
            rate);
}